

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

uint32_t Catch::Generators::Detail::getSeed(void)

{
  result_type rVar1;
  
  sharedRng();
  rVar1 = SimplePcg32::operator()(&sharedRng::s_rng);
  return rVar1;
}

Assistant:

std::uint32_t getSeed() { return sharedRng()(); }